

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O2

void chrono::collision::make_parent_relative
               (CHOBBTree *m,int bn,ChMatrix33<double> *parentR,Vector *parentTo)

{
  Vector *pVVar1;
  pointer pCVar2;
  int iVar3;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
  local_50;
  double local_40;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_38;
  
  if (make_parent_relative(chrono::collision::CHOBBTree*,int,chrono::ChMatrix33<double>&,chrono::ChVector<double>&)
      ::Rpc == '\0') {
    iVar3 = __cxa_guard_acquire(&make_parent_relative(chrono::collision::CHOBBTree*,int,chrono::ChMatrix33<double>&,chrono::ChVector<double>&)
                                 ::Rpc);
    if (iVar3 != 0) {
      __cxa_guard_release(&make_parent_relative(chrono::collision::CHOBBTree*,int,chrono::ChMatrix33<double>&,chrono::ChVector<double>&)
                           ::Rpc);
    }
  }
  if (make_parent_relative(chrono::collision::CHOBBTree*,int,chrono::ChMatrix33<double>&,chrono::ChVector<double>&)
      ::Tpc == '\0') {
    iVar3 = __cxa_guard_acquire(&make_parent_relative(chrono::collision::CHOBBTree*,int,chrono::ChMatrix33<double>&,chrono::ChVector<double>&)
                                 ::Tpc);
    if (iVar3 != 0) {
      make_parent_relative::Tpc.m_data[2] = 0.0;
      make_parent_relative::Tpc.m_data._0_16_ = ZEXT816(0);
      __cxa_guard_release(&make_parent_relative(chrono::collision::CHOBBTree*,int,chrono::ChMatrix33<double>&,chrono::ChVector<double>&)
                           ::Tpc);
    }
  }
  local_50.m_rhs =
       (RhsNested)
       (m->b).
       super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
       _M_impl.super__Vector_impl_data._M_start;
  if (-1 < ((pointer)((long)local_50.m_rhs + (long)bn * 0x80))->first_child) {
    make_parent_relative
              (m,((pointer)((long)local_50.m_rhs + (long)bn * 0x80))->first_child,
               (ChMatrix33<double> *)((long)local_50.m_rhs + (long)bn * 0x80),
               &((pointer)((long)local_50.m_rhs + (long)bn * 0x80))->To);
    pCVar2 = (m->b).
             super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar1 = &pCVar2[bn].To;
    make_parent_relative(m,*(int *)(pVVar1 + 2) + 1,&pCVar2[bn].Rot,pVVar1);
    local_50.m_rhs =
         (RhsNested)
         (m->b).
         super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  local_50.m_rhs = (RhsNested)((long)local_50.m_rhs + (long)bn * 0x80);
  local_50.m_lhs.m_matrix = &parentR->super_Matrix<double,_3,_3,_1,_3,_3>;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>,&local_50);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Matrix<double,_3,_3,_1,_3,_3> *)
             ((m->b).
              super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
              ._M_impl.super__Vector_impl_data._M_start + bn),
             &make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>);
  pCVar2 = (m->b).
           super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
           _M_impl.super__Vector_impl_data._M_start;
  make_parent_relative::Tpc.m_data[2] = pCVar2[bn].To.m_data[2] - parentTo->m_data[2];
  make_parent_relative::Tpc.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])pCVar2[bn].To.m_data,*(undefined1 (*) [16])parentTo->m_data)
  ;
  local_38.m_matrix = &parentR->super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_38,&make_parent_relative::Tpc);
  pVVar1 = &(m->b).
            super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
            _M_impl.super__Vector_impl_data._M_start[bn].To;
  if (&local_50 !=
      (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
       *)pVVar1) {
    pVVar1->m_data[0] = (double)local_50.m_lhs.m_matrix;
    pVVar1->m_data[1] = (double)local_50.m_rhs;
    pVVar1->m_data[2] = local_40;
  }
  return;
}

Assistant:

void make_parent_relative(CHOBBTree* m, int bn, ChMatrix33<>& parentR, Vector& parentTo) {
    static ChMatrix33<> Rpc;
    static Vector Tpc;

    if (!m->child(bn)->IsLeaf()) {
        // make children parent-relative

        make_parent_relative(m, m->child(bn)->first_child, m->child(bn)->Rot, m->child(bn)->To);
        make_parent_relative(m, m->child(bn)->first_child + 1, m->child(bn)->Rot, m->child(bn)->To);
    }

    // make self parent relative

    Rpc = parentR.transpose() * m->child(bn)->Rot;  // MTxM(Rpc,parentR,m->child(bn)->R);
    m->child(bn)->Rot = Rpc;                        // McM(m->child(bn)->R,Rpc);
    Tpc = Vsub(m->child(bn)->To, parentTo);         // VmV(Tpc,m->child(bn)->To,parentTo);
    m->child(bn)->To = parentR.transpose() * Tpc;   // Tpc MTxV(m->child(bn)->To,parentR,Tpc);
}